

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

void __thiscall w3Module::read_globals(w3Module *this,uint8_t **cursor)

{
  pointer pGVar1;
  w3Tag wVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong __new_size;
  ulong uVar5;
  long lVar6;
  
  uVar4 = ::read_varuint32(cursor,this->end);
  __new_size = (ulong)uVar4;
  printf("reading globals6 size:%lX\n",__new_size);
  std::vector<Global,_std::allocator<Global>_>::resize(&this->globals,__new_size);
  if (uVar4 != 0) {
    lVar6 = 8;
    uVar5 = 0;
    do {
      pGVar1 = (this->globals).super__Vector_base<Global,_std::allocator<Global>_>._M_impl.
               super__Vector_impl_data._M_start;
      wVar2 = read_valuetype(this,cursor);
      bVar3 = read_mutable(this,cursor);
      *(ushort *)((long)pGVar1 + lVar6 + -8) = CONCAT11(bVar3,wVar2);
      printf("read_globals %lX:%lX value_type:%X  mutable:%X init:%p\n",uVar5,__new_size,
             (ulong)wVar2,(ulong)bVar3,*cursor);
      DecodeInstructions(this,(vector<w3DecodedInstruction,_std::allocator<w3DecodedInstruction>_> *
                              )(&(pGVar1->global_type).value_type + lVar6),cursor,(w3Code *)0x0);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (__new_size != uVar5);
  }
  printf("read globals6 size:%lX\n",__new_size);
  return;
}

Assistant:

void w3Module::read_globals (uint8_t** cursor)
{
    //printf ("reading section 6\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading globals6 size:%" FORMAT_SIZE "X\n", size);
    globals.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        Global& a = globals [i];
        a.global_type = read_globaltype (cursor);
        printf ("read_globals %" FORMAT_SIZE "X:%" FORMAT_SIZE "X value_type:%X  mutable:%X init:%p\n", i, size, a.global_type.value_type, a.global_type.is_mutable, *cursor);
        DecodeInstructions (this, a.init, cursor, 0);
        // Init points to code -- Instructions until end of block 0x0B Instruction.
    }
    printf ("read globals6 size:%" FORMAT_SIZE "X\n", size);
}